

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Customer.cpp
# Opt level: O3

string * __thiscall
CheapCustomer::toString_abi_cxx11_(string *__return_storage_ptr__,CheapCustomer *this)

{
  pointer pcVar1;
  long lVar2;
  long *plVar3;
  size_type *psVar4;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  pcVar1 = (this->super_Customer).name._M_dataplus._M_p;
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_38,pcVar1,pcVar1 + (this->super_Customer).name._M_string_length);
  plVar3 = (long *)std::__cxx11::string::append((char *)local_38);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar4) {
    lVar2 = plVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
  }
  __return_storage_ptr__->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CheapCustomer::toString() const {return getName() + ",chp ";}